

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O0

void __thiscall QPDFWriter::Members::Members(Members *this,QPDF *pdf)

{
  bool bVar1;
  QPDFObjGen QVar2;
  QPDFObjectHandle local_50 [2];
  QPDFObjectHandle local_30;
  QPDFObjGen local_20;
  QPDF *local_18;
  QPDF *pdf_local;
  Members *this_local;
  
  this->pdf = pdf;
  local_18 = pdf;
  pdf_local = (QPDF *)this;
  QPDF::getRoot((QPDF *)&local_30);
  local_20 = QPDFObjectHandle::getObjGen(&local_30);
  bVar1 = QPDFObjGen::isIndirect(&local_20);
  if (bVar1) {
    QPDF::getRoot((QPDF *)local_50);
    QVar2 = QPDFObjectHandle::getObjGen(local_50);
    this->root_og = QVar2;
    QPDFObjectHandle::~QPDFObjectHandle(local_50);
  }
  else {
    QPDFObjGen::QPDFObjGen(&this->root_og,-1,0);
  }
  QPDFObjectHandle::~QPDFObjectHandle(&local_30);
  this->filename = "unspecified";
  this->file = (FILE *)0x0;
  this->close_file = false;
  this->buffer_pipeline = (Pl_Buffer *)0x0;
  this->output_buffer = (Buffer *)0x0;
  this->normalize_content_set = false;
  this->normalize_content = false;
  this->compress_streams = true;
  this->compress_streams_set = false;
  this->stream_decode_level = qpdf_dl_generalized;
  this->stream_decode_level_set = false;
  this->recompress_flate = false;
  this->qdf_mode = false;
  this->preserve_unreferenced_objects = false;
  this->newline_before_endstream = false;
  this->static_id = false;
  this->suppress_original_object_ids = false;
  this->direct_stream_lengths = true;
  this->encrypted = false;
  this->preserve_encryption = true;
  this->linearized = false;
  this->pclm = false;
  this->object_stream_mode = qpdf_o_preserve;
  std::__cxx11::string::string((string *)&this->encryption_key);
  this->encrypt_metadata = true;
  this->encrypt_use_aes = false;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->encryption_dictionary);
  this->encryption_V = 0;
  this->encryption_R = 0;
  std::__cxx11::string::string((string *)&this->id1);
  std::__cxx11::string::string((string *)&this->id2);
  std::__cxx11::string::string((string *)&this->final_pdf_version);
  this->final_extension_level = 0;
  std::__cxx11::string::string((string *)&this->min_pdf_version);
  this->min_extension_level = 0;
  std::__cxx11::string::string((string *)&this->forced_pdf_version);
  this->forced_extension_level = 0;
  std::__cxx11::string::string((string *)&this->extra_header_text);
  this->encryption_dict_objid = 0;
  std::__cxx11::string::string((string *)&this->cur_data_key);
  std::__cxx11::list<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_>::list
            (&this->to_delete);
  this->pipeline = (Count *)0x0;
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::vector(&this->object_queue);
  this->object_queue_front = 0;
  ObjTable::ObjTable(&this->obj);
  NewObjTable::NewObjTable(&this->new_obj);
  this->next_objid = 1;
  this->cur_stream_length_id = 0;
  this->cur_stream_length = 0;
  this->added_newline = false;
  this->max_ostream_index = 0;
  std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>::set
            (&this->normalized_streams);
  std::
  map<QPDFObjGen,_int,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>::
  map(&this->page_object_to_seq);
  std::
  map<QPDFObjGen,_int,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>::
  map(&this->contents_to_page_seq);
  std::
  map<int,_std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>_>_>_>
  ::map(&this->object_stream_to_objects);
  std::vector<Pipeline_*,_std::allocator<Pipeline_*>_>::vector(&this->pipeline_stack);
  this->next_stack_id = 2;
  std::__cxx11::string::string((string *)&this->count_buffer);
  this->deterministic_id = false;
  this->md5_pipeline = (Pl_MD5 *)0x0;
  std::__cxx11::string::string((string *)&this->deterministic_id_data);
  this->did_write_setup = false;
  std::__cxx11::string::string((string *)&this->lin_pass1_filename);
  std::shared_ptr<QPDFWriter::ProgressReporter>::shared_ptr(&this->progress_reporter);
  this->events_expected = 0;
  this->events_seen = 0;
  this->next_progress_report = 0;
  return;
}

Assistant:

QPDFWriter::Members::Members(QPDF& pdf) :
    pdf(pdf),
    root_og(pdf.getRoot().getObjGen().isIndirect() ? pdf.getRoot().getObjGen() : QPDFObjGen(-1, 0))
{
}